

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyb_parse_subtree(char *data,lyd_node *parent,lyd_node **first_sibling,char *yang_data_name,
                     int options,unres_data *unres,lyb_state *lybs)

{
  LYS_NODE LVar1;
  lys_node *plVar2;
  long lVar3;
  lys_node *local_68;
  lys_node *snode;
  lys_module *mod;
  lyd_node *iter;
  lyd_node *node;
  int ret;
  int r;
  unres_data *unres_local;
  char *pcStack_30;
  int options_local;
  char *yang_data_name_local;
  lyd_node **first_sibling_local;
  lyd_node *parent_local;
  char *data_local;
  
  node._0_4_ = 0;
  iter = (lyd_node *)0x0;
  _ret = unres;
  unres_local._4_4_ = options;
  pcStack_30 = yang_data_name;
  yang_data_name_local = (char *)first_sibling;
  first_sibling_local = (lyd_node **)parent;
  parent_local = (lyd_node *)data;
  if (((parent == (lyd_node *)0x0) || (first_sibling != (lyd_node **)0x0)) &&
     ((parent != (lyd_node *)0x0 || (first_sibling == (lyd_node **)0x0)))) {
    __assert_fail("(parent && !first_sibling) || (!parent && first_sibling)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x3f8,
                  "int lyb_parse_subtree(const char *, struct lyd_node *, struct lyd_node **, const char *, int, struct unres_data *, struct lyb_state *)"
                 );
  }
  node._4_4_ = lyb_read_start_subtree(data,lybs);
  node._0_4_ = node._4_4_ + (int)node;
  if (node._4_4_ < 0) goto LAB_001631c3;
  parent_local = (lyd_node *)((long)&parent_local->schema + (long)node._4_4_);
  if (first_sibling_local == (lyd_node **)0x0) {
    node._4_4_ = lyb_parse_model((char *)parent_local,(lys_module **)&snode,lybs);
    node._0_4_ = node._4_4_ + (int)node;
    if (node._4_4_ < 0) goto LAB_001631c3;
    parent_local = (lyd_node *)((long)&parent_local->schema + (long)node._4_4_);
    if (snode != (lys_node *)0x0) {
      node._4_4_ = lyb_parse_schema_hash
                             ((lys_node *)0x0,(lys_module *)snode,(char *)parent_local,pcStack_30,
                              unres_local._4_4_,&local_68,lybs);
    }
  }
  else {
    snode = (lys_node *)lyd_node_module((lyd_node *)first_sibling_local);
    node._4_4_ = lyb_parse_schema_hash
                           ((lys_node *)*first_sibling_local,(lys_module *)0x0,(char *)parent_local,
                            (char *)0x0,unres_local._4_4_,&local_68,lybs);
  }
  node._0_4_ = node._4_4_ + (int)node;
  if (node._4_4_ < 0) goto LAB_001631c3;
  parent_local = (lyd_node *)((long)&parent_local->schema + (long)node._4_4_);
  if ((snode == (lys_node *)0x0) || (local_68 == (lys_node *)0x0)) {
    node._4_4_ = lyb_skip_subtree((char *)parent_local,lybs);
    node._0_4_ = node._4_4_ + (int)node;
    if (node._4_4_ < 0) goto LAB_001631c3;
    parent_local = (lyd_node *)((long)&parent_local->schema + (long)node._4_4_);
    goto LAB_001631b2;
  }
  iter = lyb_new_node(local_68);
  if (iter == (lyd_node *)0x0) goto LAB_001631c3;
  node._4_4_ = lyb_parse_attributes(iter,(char *)parent_local,unres_local._4_4_,_ret,lybs);
  node._0_4_ = node._4_4_ + (int)node;
  if (node._4_4_ < 0) goto LAB_001631c3;
  parent_local = (lyd_node *)((long)&parent_local->schema + (long)node._4_4_);
  LVar1 = local_68->nodetype;
  if (LVar1 != LYS_CONTAINER) {
    if ((LVar1 == LYS_LEAF) || (LVar1 == LYS_LEAFLIST)) {
      node._4_4_ = lyb_parse_value((lys_type *)&iter->schema[1].ref,(lyd_node_leaf_list *)iter,
                                   (lyd_attr *)0x0,(char *)parent_local,_ret,lybs);
      node._0_4_ = node._4_4_ + (int)node;
      if (node._4_4_ < 0) goto LAB_001631c3;
      parent_local = (lyd_node *)((long)&parent_local->schema + (long)node._4_4_);
    }
    else if (LVar1 != LYS_LIST) {
      if (LVar1 != LYS_ANYXML) {
        if (((LVar1 == LYS_NOTIF) || (LVar1 == LYS_RPC)) || (LVar1 == LYS_ACTION))
        goto LAB_00163001;
        if (LVar1 != LYS_ANYDATA) goto LAB_001631c3;
      }
      node._4_4_ = lyb_parse_anydata(iter,(char *)parent_local,lybs);
      node._0_4_ = node._4_4_ + (int)node;
      if (node._4_4_ < 0) {
LAB_001631c3:
        lyd_free(iter);
        if ((yang_data_name_local != (char *)0x0) && (*(lyd_node **)yang_data_name_local == iter)) {
          yang_data_name_local[0] = '\0';
          yang_data_name_local[1] = '\0';
          yang_data_name_local[2] = '\0';
          yang_data_name_local[3] = '\0';
          yang_data_name_local[4] = '\0';
          yang_data_name_local[5] = '\0';
          yang_data_name_local[6] = '\0';
          yang_data_name_local[7] = '\0';
        }
        return -1;
      }
      parent_local = (lyd_node *)((long)&parent_local->schema + (long)node._4_4_);
    }
  }
LAB_00163001:
  if (first_sibling_local == (lyd_node **)0x0) {
    if (*(long *)yang_data_name_local == 0) {
      *(lyd_node **)yang_data_name_local = iter;
    }
    else {
      *(lyd_node **)(*(long *)(*(long *)yang_data_name_local + 0x20) + 0x18) = iter;
      iter->prev = *(lyd_node **)(*(long *)yang_data_name_local + 0x20);
      *(lyd_node **)(*(long *)yang_data_name_local + 0x20) = iter;
    }
  }
  else {
    if (first_sibling_local[8] == (lyd_node *)0x0) {
      first_sibling_local[8] = iter;
    }
    else {
      first_sibling_local[8]->prev->next = iter;
      iter->prev = first_sibling_local[8]->prev;
      first_sibling_local[8]->prev = iter;
    }
    iter->parent = (lyd_node *)first_sibling_local;
  }
  while (lybs->written[lybs->used + -1] != 0) {
    node._4_4_ = lyb_parse_subtree((char *)parent_local,iter,(lyd_node **)0x0,(char *)0x0,
                                   unres_local._4_4_,_ret,lybs);
    node._0_4_ = node._4_4_ + (int)node;
    if (node._4_4_ < 0) goto LAB_001631c3;
    parent_local = (lyd_node *)((long)&parent_local->schema + (long)node._4_4_);
  }
  if ((iter->schema->nodetype == LYS_CONTAINER) &&
     (plVar2 = iter->schema, lVar3._0_2_ = plVar2[1].flags, lVar3._2_1_ = plVar2[1].ext_size,
     lVar3._3_1_ = plVar2[1].iffeature_size, lVar3._4_1_ = plVar2[1].padding[0],
     lVar3._5_1_ = plVar2[1].padding[1], lVar3._6_1_ = plVar2[1].padding[2],
     lVar3._7_1_ = plVar2[1].padding[3], lVar3 == 0)) {
    for (mod = (lys_module *)iter->child;
        (mod != (lys_module *)0x0 && (((ulong)mod->name & 0x100) != 0));
        mod = (lys_module *)mod->dsc) {
    }
    if (mod == (lys_module *)0x0) {
      iter->field_0x9 = iter->field_0x9 & 0xfe | 1;
    }
  }
  if ((iter->schema->nodetype != LYS_LIST) || (iter->schema->padding[2] == '\0')) {
    lyd_hash(iter);
    lyd_insert_hash(iter);
  }
LAB_001631b2:
  lyb_read_stop_subtree(lybs);
  return (int)node;
}

Assistant:

static int
lyb_parse_subtree(const char *data, struct lyd_node *parent, struct lyd_node **first_sibling, const char *yang_data_name,
        int options, struct unres_data *unres, struct lyb_state *lybs)
{
    int r, ret = 0;
    struct lyd_node *node = NULL, *iter;
    const struct lys_module *mod;
    struct lys_node *snode;

    assert((parent && !first_sibling) || (!parent && first_sibling));

    /* register a new subtree */
    ret += (r = lyb_read_start_subtree(data, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    if (!parent) {
        /* top-level, read module name */
        ret += (r = lyb_parse_model(data, &mod, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);

        if (mod) {
            /* read hash, find the schema node starting from mod, possibly yang_data_name */
            r = lyb_parse_schema_hash(NULL, mod, data, yang_data_name, options, &snode, lybs);
        }
    } else {
        mod = lyd_node_module(parent);

        /* read hash, find the schema node starting from parent schema */
        r = lyb_parse_schema_hash(parent->schema, NULL, data, NULL, options, &snode, lybs);
    }
    ret += r;
    LYB_HAVE_READ_GOTO(r, data, error);

    if (!mod || !snode) {
        /* unknown data subtree, skip it whole */
        ret += (r = lyb_skip_subtree(data, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        goto stop_subtree;
    }

    /*
     * read the node
     */
    node = lyb_new_node(snode);
    if (!node) {
        goto error;
    }

    ret += (r = lyb_parse_attributes(node, data, options, unres, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    /* read node content */
    switch (snode->nodetype) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
        /* nothing to read */
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        ret += (r = lyb_parse_value(&((struct lys_node_leaf *)node->schema)->type, (struct lyd_node_leaf_list *)node,
                                    NULL, data, unres, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        ret += (r = lyb_parse_anydata(node, data, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        break;
    default:
        goto error;
    }

    /* insert into data tree, manually */
    if (parent) {
        if (!parent->child) {
            /* only child */
            parent->child = node;
        } else {
            /* last child */
            parent->child->prev->next = node;
            node->prev = parent->child->prev;
            parent->child->prev = node;
        }
        node->parent = parent;
    } else if (*first_sibling) {
        /* last sibling */
        (*first_sibling)->prev->next = node;
        node->prev = (*first_sibling)->prev;
        (*first_sibling)->prev = node;
    } else {
        /* only sibling */
        *first_sibling = node;
    }

    /* read all descendants */
    while (lybs->written[lybs->used - 1]) {
        ret += (r = lyb_parse_subtree(data, node, NULL, NULL, options, unres, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
    }

    /* make containers default if should be */
    if ((node->schema->nodetype == LYS_CONTAINER) && !((struct lys_node_container *)node->schema)->presence) {
        LY_TREE_FOR(node->child, iter) {
            if (!iter->dflt) {
                break;
            }
        }

        if (!iter) {
            node->dflt = 1;
        }
    }

#ifdef LY_ENABLED_CACHE
    /* calculate the hash and insert it into parent (list with keys is handled when its keys are inserted) */
    if ((node->schema->nodetype != LYS_LIST) || !((struct lys_node_list *)node->schema)->keys_size) {
        lyd_hash(node);
        lyd_insert_hash(node);
    }
#endif

stop_subtree:
    /* end the subtree */
    lyb_read_stop_subtree(lybs);

    return ret;

error:
    lyd_free(node);
    if (first_sibling && (*first_sibling == node)) {
        *first_sibling = NULL;
    }
    return -1;
}